

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

int main(void)

{
  undefined4 *__ptr;
  
  __ptr = (undefined4 *)malloc(4);
  *__ptr = 0x1bf52;
  register_callback(callback,__ptr);
  free(__ptr);
  return 0;
}

Assistant:

int main(){
    Context* ctx = malloc(sizeof(Context)); 
    ctx->id = 114514;

    // some operation

    register_callback(callback, ctx);

    // other operation

    free(ctx);
}